

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# munkres.cpp
# Opt level: O3

void trt_pose::parse::munkresStep4
               (PairGraph *star_graph,PairGraph *prime_graph,CoverTable *cover_table,
               pair<int,_int> p)

{
  ulong *puVar1;
  pointer piVar2;
  pointer piVar3;
  pointer piVar4;
  _Bit_type *p_Var5;
  byte bVar6;
  uint uVar7;
  uint *puVar8;
  int iVar9;
  uint uVar11;
  pair<int,_int> pVar12;
  ulong uVar10;
  
  uVar10 = (ulong)p >> 0x20;
  iVar9 = p.second;
  piVar2 = (star_graph->rows).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar3 = (star_graph->cols).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar8 = (uint *)(piVar3 + ((long)p >> 0x20));
  if ((int)*puVar8 < 0) {
    uVar11 = p.first;
  }
  else {
    piVar4 = (prime_graph->rows).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar7 = *puVar8;
    do {
      uVar11 = uVar7;
      pVar12.second = 0;
      pVar12.first = uVar11;
      piVar2[uVar11] = -1;
      piVar2[p.first] = (int)uVar10;
      *puVar8 = p.first;
      iVar9 = piVar4[uVar11];
      uVar10 = (ulong)iVar9;
      puVar8 = (uint *)(piVar3 + uVar10);
      p = pVar12;
      uVar7 = *puVar8;
    } while (-1 < (int)*puVar8);
  }
  piVar2[(int)uVar11] = iVar9;
  *puVar8 = uVar11;
  uVar11 = cover_table->nrows;
  if (0 < (int)uVar11) {
    p_Var5 = (cover_table->rows).super__Bvector_base<std::allocator<bool>_>._M_impl.
             super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
    uVar10 = 0;
    do {
      bVar6 = (byte)uVar10 & 0x3f;
      puVar1 = p_Var5 + (uVar10 >> 6);
      *puVar1 = *puVar1 & (-2L << bVar6 | 0xfffffffffffffffeU >> 0x40 - bVar6);
      uVar7 = (int)uVar10 + 1;
      uVar10 = (ulong)uVar7;
    } while (uVar11 != uVar7);
  }
  uVar11 = cover_table->ncols;
  if (0 < (int)uVar11) {
    p_Var5 = (cover_table->cols).super__Bvector_base<std::allocator<bool>_>._M_impl.
             super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
    uVar7 = 0;
    do {
      bVar6 = (byte)uVar7 & 0x3f;
      puVar1 = p_Var5 + (uVar7 >> 6);
      *puVar1 = *puVar1 & (-2L << bVar6 | 0xfffffffffffffffeU >> 0x40 - bVar6);
      uVar7 = uVar7 + 1;
    } while (uVar11 != uVar7);
  }
  utils::PairGraph::clear(prime_graph);
  return;
}

Assistant:

void munkresStep4(PairGraph &star_graph, PairGraph &prime_graph,
                  CoverTable &cover_table, std::pair<int, int> p) {
  // repeat until no star found in prime's column
  while (star_graph.isColSet(p.second)) {
    // find and reset star in prime's column
    std::pair<int, int> s = {star_graph.rowForCol(p.second), p.second};
    star_graph.reset(s.first, s.second);

    // set this prime to a star
    star_graph.set(p.first, p.second);

    // repeat for prime in cleared star's row
    p = {s.first, prime_graph.colForRow(s.first)};
  }
  star_graph.set(p.first, p.second);
  cover_table.clear();
  prime_graph.clear();
}